

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.c
# Opt level: O0

void paint(ATimeUs timestamp,float dt)

{
  AReFrame f;
  AMat4f a;
  AMat4f b;
  float fVar1;
  float fVar2;
  AVec3f AVar3;
  AQuat AVar4;
  undefined4 in_stack_fffffffffffffdc4;
  float in_stack_fffffffffffffdc8;
  undefined1 auVar5 [12];
  undefined4 in_stack_fffffffffffffe28;
  float fVar6;
  AMat4f local_198;
  undefined1 local_158 [8];
  AMat4f vp4;
  AMat4f model4;
  AReFrame frame;
  AGLClearParams clear;
  float t;
  float dt_local;
  ATimeUs timestamp_local;
  
  fVar1 = (float)timestamp * 1e-06;
  fVar2 = sinf(fVar1 * 0.1);
  fVar6 = 0.3;
  frame.transl.y = fVar2 * 0.3;
  fVar2 = sinf(fVar1 * 0.2);
  frame.transl.z = fVar2 * fVar6;
  sinf(fVar1 * fVar6);
  aGLClear((AGLClearParams *)&frame.transl.y,&g.target);
  fVar2 = sinf(fVar1 * 0.37);
  AVar3 = aVec3f(fVar2 * 0.7,0.2,0.7);
  AVar3 = aVec3fNormalize(AVar3);
  AVar4 = aQuatRotation(AVar3,fVar1 * -0.4);
  frame.orient.v.x = AVar4.v.z;
  frame.orient.v.y = AVar4.w;
  AVar3 = aVec3f(0.0,0.0,0.0);
  frame.transl.x = AVar3.z;
  frame.orient.v.z = AVar3.x;
  frame.orient.w = AVar3.y;
  f.orient.v.y = frame.orient.v.y;
  f.orient.v.x = frame.orient.v.x;
  f.orient.v.z = frame.orient.v.z;
  f.orient.w = (float)(int)AVar3._4_8_;
  f.transl.x = (float)(int)((ulong)AVar3._4_8_ >> 0x20);
  f.transl.y = (float)in_stack_fffffffffffffdc4;
  f.transl.z = in_stack_fffffffffffffdc8;
  aMat4fReFrame(f);
  AVar3 = aVec3f(0.0,0.0,-10.0);
  aMat4fTranslation(&local_198,AVar3);
  auVar5 = g.projection.Z._4_12_;
  a.X.z = g.projection.Y.x;
  a.X.x = (float)(int)g.projection.X._8_8_;
  a.X.y = (float)(int)((ulong)g.projection.X._8_8_ >> 0x20);
  a.X.w = (float)(int)g.projection.Y._4_8_;
  a.Y.x = (float)(int)((ulong)g.projection.Y._4_8_ >> 0x20);
  a.Y.y = g.projection.Y.w;
  a.Y.z = g.projection.Z.x;
  a.Y.w = (float)auVar5._0_4_;
  a.Z.x = (float)auVar5._4_4_;
  a.Z.y = (float)auVar5._8_4_;
  a.Z.z = g.projection.W.x;
  a.Z.w = g.projection.W.y;
  a.W.x = g.projection.W.z;
  a.W.y = g.projection.W.w;
  a.W.z = local_198.X.x;
  a.W.w = local_198.X.y;
  b.X.z = local_198.Y.x;
  b.X.w = local_198.Y.y;
  b.X.x = local_198.X.z;
  b.X.y = local_198.X.w;
  b.Y.x = local_198.Y.z;
  b.Y.y = local_198.Y.w;
  b.Y.z = local_198.Z.x;
  b.Y.w = local_198.Z.y;
  b.Z.x = local_198.Z.z;
  b.Z.y = local_198.Z.w;
  b.Z.z = local_198.W.x;
  b.Z.w = local_198.W.y;
  b.W.x = local_198.W.z;
  b.W.y = local_198.W.w;
  b.W.z = (float)in_stack_fffffffffffffe28;
  b.W.w = fVar6;
  aMat4fMul(a,b);
  g.pun[1].value.pf = &vp4.W.z;
  g.pun[0].value.pf = (GLfloat *)local_158;
  aGLDraw(&g.draw,&g.merge,&g.target);
  return;
}

Assistant:

static void paint(ATimeUs timestamp, float dt) {
	float t = timestamp * 1e-6f;
	AGLClearParams clear;
	(void)(dt);

	clear.a = 1;
	clear.r = .3f * sinf(t * .1f);
	clear.g = .3f * sinf(t * .2f);
	clear.b = .3f * sinf(t * .3f);
	clear.depth = 1;
	clear.bits = AGLCB_Everything;

	aGLClear(&clear, &g.target);

	struct AReFrame frame;
	frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(.7f * sinf(t * .37f), .2f, .7f)), -t * .4f);
	frame.transl = aVec3f(0, 0, 0);

	struct AMat4f model4 = aMat4fReFrame(frame), vp4 = aMat4fMul(g.projection, aMat4fTranslation(aVec3f(0, 0, -10)));
	g.pun[1].value.pf = &model4.X.x;
	g.pun[0].value.pf = &vp4.X.x;

	aGLDraw(&g.draw, &g.merge, &g.target);
}